

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O1

REF_STATUS
ref_search_gather_tri
          (REF_SEARCH ref_search,REF_DBL *xyz,REF_INT parent,REF_DBL *position,REF_DBL *distance)

{
  int iVar1;
  REF_STATUS RVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  REF_DBL element_dist;
  double local_38;
  
  RVar2 = 0;
  if (parent != -1 && ref_search->n != 0) {
    if (parent < 0 || ref_search->n <= parent) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
             0x118,"ref_search_gather_tri","parent invalid");
      printf("%d n %d parent\n",(ulong)(uint)ref_search->n,(ulong)(uint)parent);
      RVar2 = 1;
    }
    else if (ref_search->item[(uint)parent] != -1) {
      iVar1 = ref_search->d;
      dVar4 = 0.0;
      if (0 < (long)iVar1) {
        lVar3 = 0;
        do {
          dVar5 = position[lVar3] - ref_search->pos[(ulong)(uint)(parent * iVar1) + lVar3];
          dVar4 = dVar4 + dVar5 * dVar5;
          lVar3 = lVar3 + 1;
        } while (iVar1 != lVar3);
      }
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      if (dVar4 - ref_search->radius[(uint)parent] <= *distance) {
        lVar3 = (long)ref_search->item[(uint)parent];
        ref_search_distance3
                  (xyz + lVar3 * 9,xyz + lVar3 * 9 + 3,xyz + lVar3 * 9 + 6,position,&local_38);
        dVar5 = *distance;
        if (local_38 <= *distance) {
          dVar5 = local_38;
        }
        *distance = dVar5;
      }
      if (dVar4 - ref_search->children_ball[(uint)parent] <= *distance) {
        RVar2 = ref_search_gather_tri
                          (ref_search,xyz,ref_search->left[(uint)parent],position,distance);
        if (RVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
                 0x130,"ref_search_gather_tri",1,"gthr left");
        }
        if (RVar2 != 0) {
          return (uint)(RVar2 != 0);
        }
        RVar2 = ref_search_gather_tri
                          (ref_search,xyz,ref_search->right[(uint)parent],position,distance);
        if (RVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
                 0x133,"ref_search_gather_tri",1,"gthr right");
          return 1;
        }
      }
      RVar2 = 0;
    }
  }
  return RVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_search_gather_tri(REF_SEARCH ref_search,
                                                REF_DBL *xyz, REF_INT parent,
                                                REF_DBL *position,
                                                REF_DBL *distance) {
  REF_INT i;
  REF_DBL dist;

  if (0 == ref_search->n) return REF_SUCCESS;  /* tree empty */
  if (REF_EMPTY == parent) return REF_SUCCESS; /* finished traversing */
  RAB(0 <= parent && parent < ref_search->n, "parent invalid",
      { printf("%d n %d parent\n", ref_search->n, parent); });
  /* finished traversing */
  if (REF_EMPTY == ref_search->item[parent]) return REF_SUCCESS;

  dist = 0.0;
  for (i = 0; i < ref_search->d; i++)
    dist += pow(position[i] - ref_search->pos[i + ref_search->d * parent], 2);
  dist = sqrt(dist);

  /* if the distance between me and the target are less than combined radii */
  if (dist - ref_search->radius[parent] <= *distance) {
    REF_INT element = ref_search->item[parent];
    REF_DBL element_dist;
    RSS(ref_search_distance3(&(xyz[0 + 9 * element]), &(xyz[3 + 9 * element]),
                             &(xyz[6 + 9 * element]), position, &element_dist),
        "tri dist");
    *distance = MIN(*distance, element_dist);
  }

  /* if the distance between me and the target are less than children
   * children_ball includes child radii, so only subtract target radius */
  if (*distance >= dist - ref_search->children_ball[parent]) {
    RSS(ref_search_gather_tri(ref_search, xyz, ref_search->left[parent],
                              position, distance),
        "gthr left");
    RSS(ref_search_gather_tri(ref_search, xyz, ref_search->right[parent],
                              position, distance),
        "gthr right");
  }

  return REF_SUCCESS;
}